

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cxx
# Opt level: O0

void __thiscall Function::Function(Function *this,double d)

{
  EVP_PKEY_CTX *in_RSI;
  double d_local;
  Function *this_local;
  
  Physical::Physical(&this->super_Physical);
  (this->super_Physical)._vptr_Physical = (_func_int **)&PTR__Function_0018f008;
  std::vector<Function_*,_std::allocator<Function_*>_>::vector(&this->vParents);
  std::__cxx11::string::string((string *)&this->sName);
  init(this,in_RSI);
  this->xSrc = (double *)0x0;
  this->dValue = d;
  setType(this,CONSTANT);
  return;
}

Assistant:

Function::Function(double d)
{
	init();
	xSrc = 0;
	dValue = d;
	setType(CONSTANT);
}